

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_arccurve.cpp
# Opt level: O2

bool __thiscall
ON_ArcCurve::GetNurbFormParameterFromCurveParameter
          (ON_ArcCurve *this,double curve_t,double *nurbs_t)

{
  ON_Arc *this_00;
  bool bVar1;
  double dVar2;
  double arcnurb_t;
  double local_40;
  ON_Interval local_38;
  
  this_00 = &this->m_arc;
  local_38 = ON_Arc::DomainRadians(this_00);
  dVar2 = ON_Interval::NormalizedParameterAt(&this->m_t,curve_t);
  dVar2 = ON_Interval::ParameterAt(&local_38,dVar2);
  bVar1 = ON_Arc::GetNurbFormParameterFromRadian(this_00,dVar2,&local_40);
  if (bVar1) {
    local_38 = ON_Arc::DomainRadians(this_00);
    dVar2 = ON_Interval::NormalizedParameterAt(&local_38,local_40);
    curve_t = ON_Interval::ParameterAt(&this->m_t,dVar2);
  }
  *nurbs_t = curve_t;
  return bVar1;
}

Assistant:

bool ON_ArcCurve::GetNurbFormParameterFromCurveParameter(
      double curve_t,
      double* nurbs_t
      ) const
{
  double radians = m_arc.DomainRadians().ParameterAt(m_t.NormalizedParameterAt(curve_t));
  double arcnurb_t;
  bool rc = m_arc.GetNurbFormParameterFromRadian(radians,&arcnurb_t);
  if (rc)        // Oct 29, 2009 - Dale Lear added condition to set *nurbs_t = curve_t
    *nurbs_t = m_t.ParameterAt(m_arc.DomainRadians().NormalizedParameterAt(arcnurb_t));
  else
    *nurbs_t = curve_t;
  return rc;
}